

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_ubjson.hpp
# Opt level: O0

type jsoncons::ubjson::
     encode_ubjson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               ubjson_encode_options *options)

{
  binary_stream_sink *in_RDX;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  ubjson_stream_encoder encoder;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>
  *in_stack_fffffffffffffee8;
  ubjson_encode_options *options_00;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  binary_stream_sink *in_stack_ffffffffffffff20;
  basic_json_visitor<char> *in_stack_ffffffffffffff28;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  
  options_00 = (ubjson_encode_options *)&stack0xffffffffffffff30;
  binary_stream_sink::binary_stream_sink(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  this = (basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *)
         &stack0xffffffffffffff2f;
  std::allocator<char>::allocator();
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::basic_ubjson_encoder
            (this,in_RDX,options_00,(allocator<char> *)in_stack_fffffffffffffee8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  binary_stream_sink::~binary_stream_sink((binary_stream_sink *)this);
  make_json_visitor_adaptor<jsoncons::basic_json_visitor<char>,jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,std::allocator<char>>>
            (in_stack_fffffffffffffee8);
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  ::~json_visitor_adaptor
            ((json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
              *)0xdec056);
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_ubjson_encoder
            (this);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_ubjson(const T& j, 
                  std::ostream& os, 
                  const ubjson_encode_options& options = ubjson_encode_options())
    {
        using char_type = typename T::char_type;
        ubjson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }